

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void al_set_app_name(char *app_name)

{
  ALLEGRO_PATH *path_00;
  char *in_RDI;
  ALLEGRO_PATH *path;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  
  if (in_RDI == (char *)0x0) {
    path_00 = al_get_standard_path(in_stack_ffffffffffffffec);
    al_get_path_filename((ALLEGRO_PATH *)0x17ea62);
    _al_sane_strncpy(in_RDI,(char *)path_00,
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    al_destroy_path(path_00);
  }
  else {
    _al_sane_strncpy(in_RDI,in_stack_fffffffffffffff0,
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

void al_set_app_name(const char *app_name)
{
   if (app_name) {
      _al_sane_strncpy(_al_app_name, app_name, sizeof(_al_app_name));
   }
   else {
      ALLEGRO_PATH *path;
      path = al_get_standard_path(ALLEGRO_EXENAME_PATH);
      _al_sane_strncpy(_al_app_name, al_get_path_filename(path), sizeof(_al_app_name));
      al_destroy_path(path);
   }
}